

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

void spvc_compiler_set_member_name
               (spvc_compiler compiler,spvc_type_id id,uint member_index,char *argument)

{
  char *pcVar1;
  uint32_t index;
  pointer this;
  allocator local_49;
  string local_48;
  TypeID local_24;
  char *local_20;
  char *argument_local;
  uint member_index_local;
  spvc_type_id id_local;
  spvc_compiler compiler_local;
  
  local_20 = argument;
  argument_local._0_4_ = member_index;
  argument_local._4_4_ = id;
  _member_index_local = compiler;
  this = std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
         operator->(&compiler->compiler);
  spirv_cross::TypedID<(spirv_cross::Types)1>::TypedID(&local_24,argument_local._4_4_);
  index = (uint)argument_local;
  pcVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,pcVar1,&local_49);
  spirv_cross::Compiler::set_member_name(this,local_24,index,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

void spvc_compiler_set_member_name(spvc_compiler compiler, spvc_type_id id, unsigned member_index, const char *argument)
{
	compiler->compiler->set_member_name(id, member_index, argument);
}